

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marker-index.cc
# Opt level: O0

int __thiscall MarkerIndex::compare(MarkerIndex *this,MarkerId id1,MarkerId id2)

{
  int iVar1;
  Point local_40;
  Point local_38;
  Point local_30;
  Point local_28;
  MarkerId local_20;
  MarkerId local_1c;
  MarkerId id2_local;
  MarkerId id1_local;
  MarkerIndex *this_local;
  
  local_20 = id2;
  local_1c = id1;
  _id2_local = this;
  local_28 = get_start(this,id1);
  local_30 = get_start(this,local_20);
  iVar1 = Point::compare(&local_28,&local_30);
  if (iVar1 == -1) {
    this_local._4_4_ = -1;
  }
  else if (iVar1 == 1) {
    this_local._4_4_ = 1;
  }
  else {
    local_38 = get_end(this,local_20);
    local_40 = get_end(this,local_1c);
    this_local._4_4_ = Point::compare(&local_38,&local_40);
  }
  return this_local._4_4_;
}

Assistant:

int MarkerIndex::compare(MarkerId id1, MarkerId id2) const {
  switch (get_start(id1).compare(get_start(id2))) {
    case -1:
      return -1;
    case 1:
      return 1;
    default:
      return get_end(id2).compare(get_end(id1));
  }
}